

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

Float __thiscall pbrt::ImageChannelValues::MaxValue(ImageChannelValues *this)

{
  float *pfVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  undefined1 auVar3 [16];
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  int i;
  ulong uVar5;
  undefined1 auVar6 [64];
  
  paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
            *)(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
  paVar4 = &(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
  if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)0x0) {
    paVar4 = paVar2;
  }
  auVar6 = ZEXT464((uint)paVar4->fixed[0]);
  uVar5 = 1;
  while (uVar5 < (this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).
                 nStored) {
    pfVar1 = paVar4->fixed + uVar5;
    uVar5 = uVar5 + 1;
    auVar3 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar6._0_16_);
    auVar6 = ZEXT1664(auVar3);
  }
  return auVar6._0_4_;
}

Assistant:

end() const { return begin() + nStored; }